

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledRgbaInputFile::setFrameBuffer
          (TiledRgbaInputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  string *__lhs;
  pthread_mutex_t *__mutex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 in_R10B;
  lock_guard<std::mutex> lock;
  size_t yst;
  size_t xst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  FrameBuffer fb;
  Slice local_60;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    FromYa::setFrameBuffer(this->_fromYa,base,xStride,yStride,&this->_channelNamePrefix);
    pthread_mutex_unlock(__mutex);
    return;
  }
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __lhs = &this->_channelNamePrefix;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pbVar1 = std::operator+(&local_b0,__lhs,"R");
  xst = xStride << 3;
  yst = yStride << 3;
  Slice::Slice(&local_60,HALF,(char *)base,xst,yst,1,1,0.0,(bool)in_R10B,SUB81(pbVar1,0));
  FrameBuffer::insert(&fb,&local_b0,&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  pbVar1 = std::operator+(&local_b0,__lhs,"G");
  Slice::Slice(&local_60,HALF,(char *)&base->g,xst,yst,1,1,0.0,(bool)in_R10B,SUB81(pbVar1,0));
  FrameBuffer::insert(&fb,&local_b0,&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  pbVar1 = std::operator+(&local_b0,__lhs,"B");
  Slice::Slice(&local_60,HALF,(char *)&base->b,xst,yst,1,1,0.0,(bool)in_R10B,SUB81(pbVar1,0));
  FrameBuffer::insert(&fb,&local_b0,&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  pbVar1 = std::operator+(&local_b0,__lhs,"A");
  Slice::Slice(&local_60,HALF,(char *)&base->a,xst,yst,1,1,1.0,(bool)in_R10B,SUB81(pbVar1,0));
  FrameBuffer::insert(&fb,&local_b0,&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  TiledInputFile::setFrameBuffer(this->_inputFile,&fb);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  return;
}

Assistant:

void
TiledRgbaInputFile::setFrameBuffer (Rgba* base, size_t xStride, size_t yStride)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        _fromYa->setFrameBuffer (base, xStride, yStride, _channelNamePrefix);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        fb.insert (
            _channelNamePrefix + "R",
            Slice (
                HALF,
                (char*) &base[0].r,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "G",
            Slice (
                HALF,
                (char*) &base[0].g,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "B",
            Slice (
                HALF,
                (char*) &base[0].b,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                0.0)); // fillValue

        fb.insert (
            _channelNamePrefix + "A",
            Slice (
                HALF,
                (char*) &base[0].a,
                xs,
                ys,
                1,
                1,     // xSampling, ySampling
                1.0)); // fillValue

        _inputFile->setFrameBuffer (fb);
    }
}